

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O1

void density::f_default_construct::invoke<density_tests::PolymorphicBase>(void *i_dest)

{
  *(undefined8 *)i_dest = 0;
  *(undefined8 *)((long)i_dest + 8) = 0;
  *(undefined8 *)((long)i_dest + 0x10) = 0;
  *(undefined8 *)((long)i_dest + 0x18) = 0;
  *(undefined4 *)((long)i_dest + 8) = 0x23;
  density_tests::InstanceCounted::new_instance((InstanceCounted *)((long)i_dest + 0xc));
  *(undefined ***)i_dest = &PTR_class_id_010792f8;
  *(undefined8 *)((long)i_dest + 0x10) = 0x4036000000000000;
  density_tests::InstanceCounted::new_instance((InstanceCounted *)((long)i_dest + 0x18));
  return;
}

Assistant:

static void invoke(void * i_dest)
        {
            DENSITY_ASSUME(i_dest != nullptr);
            new (i_dest) TARGET_TYPE();
        }